

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_mktime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  tm *__tp;
  time_t iValue;
  time_t t;
  time_t tStack_28;
  
  pcVar1 = (pCtx->pFunc->sName).zString;
  time(&tStack_28);
  if (*pcVar1 == 'g') {
    __tp = gmtime(&tStack_28);
  }
  else {
    __tp = localtime(&tStack_28);
  }
  if (0 < nArg) {
    iVar2 = jx9_value_to_int(*apArg);
    __tp->tm_hour = iVar2;
    if (nArg != 1) {
      iVar2 = jx9_value_to_int(apArg[1]);
      __tp->tm_min = iVar2;
      if (2 < (uint)nArg) {
        iVar2 = jx9_value_to_int(apArg[2]);
        __tp->tm_sec = iVar2;
        if (nArg != 3) {
          iVar2 = jx9_value_to_int(apArg[3]);
          __tp->tm_mon = iVar2 + -1;
          if (4 < (uint)nArg) {
            iVar2 = jx9_value_to_int(apArg[4]);
            __tp->tm_mday = iVar2;
            if (nArg != 5) {
              iVar3 = jx9_value_to_int(apArg[5]);
              iVar2 = iVar3 + -0x76c;
              if (iVar3 < 0x76d) {
                iVar2 = iVar3;
              }
              __tp->tm_year = iVar2;
              if (6 < (uint)nArg) {
                iVar2 = jx9_value_to_bool(apArg[6]);
                __tp->tm_isdst = iVar2;
              }
            }
          }
        }
      }
    }
  }
  iValue = mktime(__tp);
  jx9_result_int64(pCtx,iValue);
  return 0;
}

Assistant:

static int jx9Builtin_mktime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFunction;
	jx9_int64 iVal = 0;
	struct tm *pTm;
	time_t t;
	/* Extract function name */
	zFunction = jx9_function_name(pCtx);
	/* Get the current time */
	time(&t);
	if( zFunction[0] == 'g' /* gmmktime */ ){
		pTm = gmtime(&t);
	}else{
		/* localtime */
		pTm = localtime(&t);
	}
	if( nArg > 0 ){
		int iVal;
		/* Hour */
		iVal = jx9_value_to_int(apArg[0]);
		pTm->tm_hour = iVal;
		if( nArg > 1 ){
			/* Minutes */
			iVal = jx9_value_to_int(apArg[1]);
			pTm->tm_min = iVal;
			if( nArg > 2 ){
				/* Seconds */
				iVal = jx9_value_to_int(apArg[2]);
				pTm->tm_sec = iVal;
				if( nArg > 3 ){
					/* Month */
					iVal = jx9_value_to_int(apArg[3]);
					pTm->tm_mon = iVal - 1;
					if( nArg > 4 ){
						/* mday */
						iVal = jx9_value_to_int(apArg[4]);
						pTm->tm_mday = iVal;
						if( nArg > 5 ){
							/* Year */
							iVal = jx9_value_to_int(apArg[5]);
							if( iVal > 1900 ){
								iVal -= 1900;
							}
							pTm->tm_year = iVal;
							if( nArg > 6 ){
								/* is_dst */
								iVal = jx9_value_to_bool(apArg[6]);
								pTm->tm_isdst = iVal;
							}
						}
					}
				}
			}
		}
	}
	/* Make the time */
	iVal = (jx9_int64)mktime(pTm);
	/* Return the timesatmp as a 64bit integer */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}